

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-patch.cpp
# Opt level: O1

void nlohmann::json_patch::validateJsonPatch(json *patch)

{
  bool bVar1;
  int iVar2;
  reference this;
  const_reference pvVar3;
  const_iterator __end1;
  const_iterator __begin1;
  iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_118;
  const_iterator local_f8;
  string_t local_d8;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((validateJsonPatch(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
       ::patch_validator == '\0') &&
     (iVar2 = __cxa_guard_acquire(&validateJsonPatch(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
                                   ::patch_validator), iVar2 != 0)) {
    local_68 = (code *)0x0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    local_a8 = (code *)0x0;
    uStack_a0 = 0;
    json_schema::json_validator::json_validator
              (&validateJsonPatch::patch_validator,
               (json *)(anonymous_namespace)::patch_schema_abi_cxx11_,(schema_loader *)&local_78,
               (format_checker *)&local_98,(content_checker *)&local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    __cxa_atexit(json_schema::json_validator::~json_validator,&validateJsonPatch::patch_validator,
                 &__dso_handle);
    __cxa_guard_release(&validateJsonPatch(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
                         ::patch_validator);
  }
  json_schema::json_validator::validate
            ((json_validator *)&local_58,(json *)&validateJsonPatch::patch_validator);
  json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_58);
  json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cbegin(&local_f8,patch);
  local_118.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_118.m_it.array_iterator._M_current = (pointer)0x0;
  local_118.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (patch->m_type == array) {
    local_118.m_it.array_iterator._M_current =
         (((patch->m_value).array)->
         super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (patch->m_type == object) {
    local_118.m_it.object_iterator._M_node =
         &(((patch->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_118.m_it.primitive_iterator.m_it = 1;
  }
  local_118.m_object = patch;
  bVar1 = json_abi_v3_11_2::detail::
          iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    (&local_f8,&local_118);
  if (!bVar1) {
    do {
      this = json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_f8);
      pvVar3 = json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this,"path");
      json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_d8,pvVar3);
      json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::split(&local_48,&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((local_f8.m_object)->m_type == array) {
        local_f8.m_it.array_iterator._M_current = local_f8.m_it.array_iterator._M_current + 1;
      }
      else if ((local_f8.m_object)->m_type == object) {
        local_f8.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_f8.m_it.object_iterator._M_node);
      }
      else {
        local_f8.m_it.primitive_iterator.m_it = local_f8.m_it.primitive_iterator.m_it + 1;
      }
      bVar1 = json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        (&local_f8,&local_118);
    } while (!bVar1);
  }
  return;
}

Assistant:

void json_patch::validateJsonPatch(json const &patch)
{
	// static put here to have it created at the first usage of validateJsonPatch
	static nlohmann::json_schema::json_validator patch_validator(patch_schema);

	patch_validator.validate(patch);

	for (auto const &op : patch)
		json::json_pointer(op["path"].get<std::string>());
}